

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::RemoveNesting(ON_PolyCurve *this)

{
  ON_SimpleArray<double> *src;
  ON_CurveArray *src_00;
  uint uVar1;
  ON_PolyCurve *poly;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ON_SimpleArray<ON_Curve_*> old_seg;
  ON_SimpleArray<double> old_t;
  ON_SimpleArray<ON_Curve_*> local_70;
  ON_Interval local_58;
  ON_SimpleArray<double> local_48;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  src = &this->m_t;
  ON_SimpleArray<double>::ON_SimpleArray(&local_48,src);
  src_00 = &this->m_segment;
  ON_SimpleArray<ON_Curve_*>::ON_SimpleArray(&local_70,&src_00->super_ON_SimpleArray<ON_Curve_*>);
  if (0 < (this->m_t).m_capacity) {
    (this->m_t).m_count = 1;
  }
  if (-1 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity) {
    (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count = 0;
  }
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  bVar3 = false;
  for (; uVar2 * 8 != uVar4; uVar4 = uVar4 + 8) {
    poly = Cast(*(ON_Object **)((long)local_70.m_a + uVar4));
    if (poly == (ON_PolyCurve *)0x0) {
      ON_SimpleArray<double>::Append(src,(double *)((long)local_48.m_a + uVar4 + 8));
      ON_SimpleArray<ON_Curve_*>::Append
                (&src_00->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)((long)local_70.m_a + uVar4)
                );
    }
    else {
      ON_Interval::ON_Interval
                (&local_58,*(double *)((long)local_48.m_a + uVar4),
                 *(double *)((long)local_48.m_a + uVar4 + 8));
      Flatten(poly,local_58,src,&src_00->super_ON_SimpleArray<ON_Curve_*>);
      (*(poly->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(poly);
      bVar3 = true;
    }
  }
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_70);
  ON_SimpleArray<double>::~ON_SimpleArray(&local_48);
  return bVar3;
}

Assistant:

bool ON_PolyCurve::RemoveNesting( )
{
  bool rc = false;
	int n = Count();

	ON_SimpleArray<double> old_t = m_t;
	ON_SimpleArray<ON_Curve*> old_seg = m_segment;

	m_t.SetCount(1);
	m_segment.SetCount(0);

	for(int i=0; i<n;i++){
		ON_PolyCurve* poly = ON_PolyCurve::Cast( old_seg[i]);
		if(poly){
      rc = true;
			Flatten( poly, ON_Interval(old_t[i], old_t[i+1]), m_t, m_segment );
			delete poly;
		} else {
			m_t.Append( old_t[i+1]); 
			m_segment.Append( old_seg[i] );
		}
	}
  return rc;
}